

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileStorageCommitState::AddRowGroupData
          (SingleFileStorageCommitState *this,DataTable *table,idx_t start_index,idx_t count,
          unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
          *row_group_data)

{
  undefined8 uVar1;
  bool bVar2;
  pointer this_00;
  DataTableInfo *pDVar3;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  iterator iVar4;
  InternalException *this_02;
  AttachedDatabase *local_70;
  undefined8 local_68;
  undefined1 local_60 [32];
  AttachedDatabase *local_40;
  idx_t local_38;
  undefined8 local_30;
  
  local_70 = (AttachedDatabase *)start_index;
  this_00 = unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
            ::operator->(row_group_data);
  bVar2 = PersistentCollectionData::HasUpdates(this_00);
  if (!bVar2) {
    pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&table->info);
    bVar2 = TableIndexList::Empty(&pDVar3->indexes);
    if (bVar2) {
      local_60._0_8_ = table;
      this_01 = &::std::__detail::
                 _Map_base<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->optimistically_written_data,(key_type *)local_60)->_M_h;
      iVar4 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,(key_type *)&local_70);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>,_false>
          ._M_cur != (__node_type *)0x0) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_60._0_8_ = local_60 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,
                   "FIXME: AddOptimisticallyWrittenRowGroup is writing a duplicate row group","");
        InternalException::InternalException(this_02,(string *)local_60);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_60._24_8_ =
           (row_group_data->
           super_unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PersistentCollectionData_*,_std::default_delete<duckdb::PersistentCollectionData>_>
           .super__Head_base<0UL,_duckdb::PersistentCollectionData_*,_false>._M_head_impl;
      (row_group_data->
      super_unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PersistentCollectionData_*,_std::default_delete<duckdb::PersistentCollectionData>_>
      .super__Head_base<0UL,_duckdb::PersistentCollectionData_*,_false>._M_head_impl =
           (PersistentCollectionData *)0x0;
      local_40 = local_70;
      local_68 = 0;
      local_60._0_8_ = local_70;
      local_60._8_8_ = local_70;
      local_30 = 0;
      local_60._16_8_ = count;
      local_38 = count;
      ::std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>,std::allocator<std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long,duckdb::OptimisticallyWrittenRowGroupData>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>,std::allocator<std::pair<unsigned_long_const,duckdb::OptimisticallyWrittenRowGroupData>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_01,local_60);
      uVar1 = local_60._24_8_;
      if ((PersistentCollectionData *)local_60._24_8_ != (PersistentCollectionData *)0x0) {
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        ~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 *)local_60._24_8_);
        operator_delete((void *)uVar1);
      }
    }
  }
  return;
}

Assistant:

void SingleFileStorageCommitState::AddRowGroupData(DataTable &table, idx_t start_index, idx_t count,
                                                   unique_ptr<PersistentCollectionData> row_group_data) {
	if (row_group_data->HasUpdates()) {
		// cannot serialize optimistic block pointers if in-memory updates exist
		return;
	}
	if (table.HasIndexes()) {
		// cannot serialize optimistic block pointers if the table has indexes
		return;
	}
	auto &entries = optimistically_written_data[table];
	auto entry = entries.find(start_index);
	if (entry != entries.end()) {
		throw InternalException("FIXME: AddOptimisticallyWrittenRowGroup is writing a duplicate row group");
	}
	entries.insert(
	    make_pair(start_index, OptimisticallyWrittenRowGroupData(start_index, count, std::move(row_group_data))));
}